

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O3

void __thiscall ftxui::Border::Render(Border *this,Screen *screen)

{
  (**(code **)((long)((((this->super_Node).children_.
                        super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     _vptr_Node + 0x20))();
  if (((this->super_Node).box_.x_min < (this->super_Node).box_.x_max) &&
     ((this->super_Node).box_.y_min < (this->super_Node).box_.y_max)) {
    if ((this->charset).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->charset).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      RenderPixel(this,screen);
      return;
    }
    RenderChar(this,screen);
    return;
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max)
      return;

    if (!charset.empty())
      RenderPixel(screen);
    else
      RenderChar(screen);
  }